

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_proj.c
# Opt level: O3

int CVodeSetProjFailEta(void *cvode_mem,sunrealtype eta)

{
  int iVar1;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  CVodeProjMem local_20;
  double local_18;
  CVodeMem local_8;
  
  local_18 = eta;
  iVar1 = cvAccessProjMem(cvode_mem,"CVodeSetProjFailEta",&local_8,&local_20);
  if (iVar1 == 0) {
    local_20->eta_pfail =
         (sunrealtype)
         (-(ulong)(local_18 <= 0.0) & 0x3fd0000000000000 |
         ~-(ulong)(local_18 <= 0.0) &
         (~-(ulong)(1.0 < local_18) & (ulong)local_18 |
         -(ulong)(1.0 < local_18) & 0x3fd0000000000000));
  }
  return iVar1;
}

Assistant:

int CVodeSetProjFailEta(void* cvode_mem, sunrealtype eta)
{
  int retval;
  CVodeMem cv_mem;
  CVodeProjMem proj_mem;

  /* Access memory structures */
  retval = cvAccessProjMem(cvode_mem, __func__, &cv_mem, &proj_mem);
  if (retval != CV_SUCCESS) { return (retval); }

  /* Set the step size reduction factor for a projection failure */
  if ((eta <= ZERO) || (eta > ONE))
  {
    /* Restore default */
    proj_mem->eta_pfail = PROJ_FAIL_ETA;
  }
  else
  {
    /* Update the eta value */
    proj_mem->eta_pfail = eta;
  }

  return (CV_SUCCESS);
}